

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O0

void __thiscall RTIMUSettings::RTIMUSettings(RTIMUSettings *this,char *productType)

{
  size_t sVar1;
  char *productType_local;
  RTIMUSettings *this_local;
  
  RTIMUHal::RTIMUHal(&this->super_RTIMUHal);
  (this->super_RTIMUHal)._vptr_RTIMUHal = (_func_int **)&PTR__RTIMUSettings_00134590;
  RTVector3::RTVector3(&this->m_compassCalMin);
  RTVector3::RTVector3(&this->m_compassCalMax);
  RTVector3::RTVector3(&this->m_compassCalEllipsoidOffset);
  RTVector3::RTVector3(&this->m_accelCalMin);
  RTVector3::RTVector3(&this->m_accelCalMax);
  RTVector3::RTVector3(&this->m_gyroBias);
  sVar1 = strlen(productType);
  if (sVar1 < 0xc9) {
    sVar1 = strlen(productType);
    if (sVar1 != 0) {
      sprintf(this->m_filename,"%s.ini",productType);
      goto LAB_00115323;
    }
  }
  fprintf(_stderr,"Product name too long or null - using default\n");
  strcpy(this->m_filename,"RTIMULib.ini");
LAB_00115323:
  (*(this->super_RTIMUHal)._vptr_RTIMUHal[2])();
  return;
}

Assistant:

RTIMUSettings::RTIMUSettings(const char *productType)
{
    if ((strlen(productType) > 200) || (strlen(productType) == 0)) {
        HAL_ERROR("Product name too long or null - using default\n");
        strcpy(m_filename, "RTIMULib.ini");
    } else {
        sprintf(m_filename, "%s.ini", productType);
    }
    loadSettings();
}